

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

int __thiscall Sphere::init(Sphere *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double local_b8;
  undefined1 local_68 [16];
  double local_58;
  Vector3 local_48;
  
  local_b8 = -1.0;
  iVar2 = -1;
  do {
    dVar6 = -1.0;
    iVar3 = -1;
    do {
      iVar4 = -3;
      dVar7 = -1.0;
      do {
        dVar1 = this->r;
        local_58 = dVar1 * dVar7;
        local_68._8_4_ = SUB84(dVar1 * dVar6,0);
        local_68._0_8_ = dVar1 * local_b8;
        local_68._12_4_ = (int)((ulong)(dVar1 * dVar6) >> 0x20);
        operator+(&this->center,(Vector3 *)local_68);
        BoundingBox::include(&this->bbox,&local_48);
        dVar7 = dVar7 + 2.0;
        iVar4 = iVar4 + 2;
      } while (iVar4 < 0);
      dVar6 = dVar6 + 2.0;
      bVar5 = iVar3 < 0;
      iVar3 = iVar3 + 2;
    } while (bVar5);
    local_b8 = local_b8 + 2.0;
    iVar3 = iVar2 + 2;
    bVar5 = iVar2 < 0;
    iVar2 = iVar3;
  } while (bVar5);
  return iVar3;
}

Assistant:

void Sphere::init()
{
    for (int i = -1; i < 2; i += 2)
        for (int j = -1; j < 2; j += 2)
            for (int k = -1; k < 2; k += 2)
                bbox.include(center + Vector3(i * r, j * r, k * r));
    Primitive::init();
}